

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall
baryonyx::details::ap_pnm_observer::make_observation<long_double>
          (ap_pnm_observer *this,sparse_matrix<int> *ap,longdouble *P,longdouble *param_3)

{
  bool bVar1;
  rgb rVar2;
  __tuple_element_t<0UL,_tuple<const_row_value_*,_const_row_value_*>_> *pprVar3;
  __tuple_element_t<1UL,_tuple<const_row_value_*,_const_row_value_*>_> *pprVar4;
  remove_reference_t<int> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  undefined1 local_12c [4];
  string local_128;
  undefined2 local_103;
  uint8_t local_101;
  pointer_type puStack_100;
  rgb color_rgb;
  uint8_t *pointer;
  type *et;
  type *it;
  int local_d8;
  undefined4 local_d4;
  int k;
  pnm_array pnm;
  colormap cm;
  longdouble *param_3_local;
  longdouble *P_local;
  sparse_matrix<int> *ap_local;
  ap_pnm_observer *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *vargs;
  string *local_48;
  char *local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_10;
  
  colormap::colormap<float>((colormap *)&pnm.m_width,-1.0,1.0);
  pnm_array::pnm_array((pnm_array *)&k,this->constraints,this->variables);
  bVar1 = pnm_array::operator_cast_to_bool((pnm_array *)&k);
  if (bVar1) {
    pnm_array::clear((pnm_array *)&k);
    for (local_d8 = 0; local_d8 != this->constraints; local_d8 = local_d8 + 1) {
      sparse_matrix<int>::row((sparse_matrix<int> *)&it,(int)ap);
      pprVar3 = std::
                get<0ul,baryonyx::sparse_matrix<int>::row_value_const*,baryonyx::sparse_matrix<int>::row_value_const*>
                          ((tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
                            *)&it);
      pprVar4 = std::
                get<1ul,baryonyx::sparse_matrix<int>::row_value_const*,baryonyx::sparse_matrix<int>::row_value_const*>
                          ((tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
                            *)&it);
      while (*pprVar3 != *pprVar4) {
        puStack_100 = pnm_array::operator()((pnm_array *)&k,(long)local_d8,(long)(*pprVar3)->column)
        ;
        rVar2 = colormap::operator()((colormap *)&pnm.m_width,P[(*pprVar3)->value]);
        local_101 = rVar2.blue;
        local_103._0_1_ = rVar2.red;
        *puStack_100 = (uint8_t)local_103;
        local_103._1_1_ = rVar2.green;
        puStack_100[1] = local_103._1_1_;
        puStack_100[2] = local_101;
        *pprVar3 = *pprVar3 + 1;
        local_103 = rVar2._0_2_;
      }
    }
    local_48 = &this->m_basename;
    local_12c = (undefined1  [4])this->m_frame;
    this->m_frame = (int)local_12c + 1;
    local_38 = local_12c + 4;
    local_40 = "{}-P-{}.pnm";
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             *)local_12c;
    ::fmt::v7::make_args_checked<std::__cxx11::string&,int,char[12],char>
              (&local_78,(v7 *)"{}-P-{}.pnm",(char (*) [12])local_48,
               (remove_reference_t<std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
    local_58 = &local_78;
    local_88 = ::fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x1d,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_88.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              ((string *)(local_12c + 4),(detail *)local_88.data_,format_str,args);
    pnm_array::operator()((pnm_array *)&k,(string *)(local_12c + 4));
    std::__cxx11::string::~string((string *)(local_12c + 4));
    local_d4 = 0;
  }
  else {
    local_d4 = 1;
  }
  pnm_array::~pnm_array((pnm_array *)&k);
  return;
}

Assistant:

void make_observation(const sparse_matrix<int>& ap,
                          const Float* P,
                          const Float* /*pi*/)
    {
        static_assert(std::is_floating_point<Float>::value);

        colormap cm(-1.0f, 1.0f);
        pnm_array pnm(constraints, variables);
        if (!pnm)
            return;

        pnm.clear();
        for (int k = 0; k != constraints; ++k) {
            auto [it, et] = ap.row(k);

            for (; it != et; ++it) {
                std::uint8_t* pointer = pnm(k, it->column);
                auto color_rgb = cm(P[it->value]);

                pointer[0] = color_rgb.red;
                pointer[1] = color_rgb.green;
                pointer[2] = color_rgb.blue;
            }
        }

        pnm(fmt::format("{}-P-{}.pnm", m_basename, m_frame++));
    }